

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,char *methodName,uint64_t typeId,uint16_t methodId)

{
  char *pcVar1;
  size_t sVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  undefined6 in_register_00000082;
  undefined2 in_R9W;
  Promise<void> PVar4;
  undefined6 in_stack_fffffffffffffe40;
  String local_1b8;
  _func_int **local_198;
  ClientHook *pCStack_190;
  char *local_188;
  uint64_t local_180;
  char *local_178;
  Exception local_170;
  
  local_188 = (char *)CONCAT62(in_register_00000082,methodId);
  local_180 = typeId;
  local_178 = methodName;
  kj::_::Debug::
  makeDescription<char_const(&)[24],char_const*&,unsigned_long&,char_const*&,unsigned_short&>
            (&local_1b8,
             (Debug *)"\"Method not implemented.\", interfaceName, typeId, methodName, methodId",
             "Method not implemented.",(char (*) [24])&local_178,&local_188,&local_180,
             (char **)&stack0xfffffffffffffe46,
             (unsigned_short *)CONCAT26(in_R9W,in_stack_fffffffffffffe40));
  kj::Exception::Exception
            (&local_170,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x56,&local_1b8);
  kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_198,&local_170);
  this->_vptr_Server = local_198;
  this->thisHook = pCStack_190;
  kj::Exception::~Exception(&local_170);
  sVar2 = local_1b8.content.size_;
  pcVar1 = local_1b8.content.ptr;
  pPVar3 = extraout_RDX;
  if (local_1b8.content.ptr != (char *)0x0) {
    local_1b8.content.ptr = (char *)0x0;
    local_1b8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1b8.content.disposer)
              (local_1b8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pPVar3 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* interfaceName, const char* methodName, uint64_t typeId, uint16_t methodId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName,
                      typeId, methodName, methodId);
}